

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<nwcpp::Variable,_nwcpp::Node> * __thiscall
pybind11::class_<nwcpp::Variable,nwcpp::Node>::def<std::__cxx11::string(*)(nwcpp::Variable_const&)>
          (class_<nwcpp::Variable,nwcpp::Node> *this,char *name_,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Variable_ptr **f)

{
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_Variable_ptr *f_00;
  cpp_function cf;
  handle local_48;
  cpp_function local_40;
  object local_38;
  is_method local_30;
  name local_28;
  sibling local_20;
  
  f_00 = *f;
  local_30.class_.m_ptr = *(handle *)this;
  local_38.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_28.value = name_;
  getattr((pybind11 *)&local_48,local_30.class_,name_,(PyObject *)&_Py_NoneStruct);
  local_20.value.m_ptr = (handle)(handle)local_48.m_ptr;
  cpp_function::
  cpp_function<std::__cxx11::string,nwcpp::Variable_const&,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_40,f_00,&local_28,&local_30,&local_20);
  object::~object((object *)&local_48);
  object::~object(&local_38);
  detail::add_class_method((object *)this,name_,&local_40);
  object::~object((object *)&local_40);
  return (class_<nwcpp::Variable,_nwcpp::Node> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }